

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_11::WriteBatchItemPrinter::Put
          (WriteBatchItemPrinter *this,Slice *key,Slice *value)

{
  string r;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  Status local_50;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"  put \'",(allocator *)&local_60);
  AppendEscapedStringTo(&local_48,key);
  std::__cxx11::string::append((char *)&local_48);
  AppendEscapedStringTo(&local_48,value);
  std::__cxx11::string::append((char *)&local_48);
  local_60 = local_48._M_dataplus._M_p._0_4_;
  uStack_5c = local_48._M_dataplus._M_p._4_4_;
  uStack_58 = (undefined4)local_48._M_string_length;
  uStack_54 = local_48._M_string_length._4_4_;
  (*this->dst_->_vptr_WritableFile[2])(&local_50,this->dst_,&local_60);
  Status::~Status(&local_50);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Put(const Slice& key, const Slice& value) override {
    std::string r = "  put '";
    AppendEscapedStringTo(&r, key);
    r += "' '";
    AppendEscapedStringTo(&r, value);
    r += "'\n";
    dst_->Append(r);
  }